

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&>
* __thiscall
Catch::ExprLhs<std::pair<unsigned_long,unsigned_long>const&>::operator==
          (BinaryExpr<const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&>
           *__return_storage_ptr__,ExprLhs<std::pair<unsigned_long,unsigned_long>const&> *this,
          pair<unsigned_long,_unsigned_long> *rhs)

{
  pair<unsigned_long,_unsigned_long> *lhs;
  bool comparisonResult;
  StringRef local_30;
  pair<unsigned_long,_unsigned_long> *local_20;
  pair<unsigned_long,_unsigned_long> *rhs_local;
  ExprLhs<const_std::pair<unsigned_long,_unsigned_long>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (pair<unsigned_long,_unsigned_long> *)this;
  this_local = (ExprLhs<const_std::pair<unsigned_long,_unsigned_long>_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>>
                 (*(pair<unsigned_long,_unsigned_long> **)this,rhs);
  lhs = *(pair<unsigned_long,_unsigned_long> **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_std::pair<unsigned_long,_unsigned_long>_&,_const_std::pair<unsigned_long,_unsigned_long>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }